

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O2

int AdjustAndCheckRectangle(WebPPicture *pic,int *left,int *top,int width,int height)

{
  uint uVar1;
  
  if (pic->use_argb == 0) {
    *(byte *)left = (byte)*left & 0xfe;
    *(byte *)top = (byte)*top & 0xfe;
  }
  uVar1 = 0;
  if ((((-1 < *left) && (-1 < *top)) && (0 < height && 0 < width)) && (*left + width <= pic->width))
  {
    uVar1 = (uint)(*top + height <= pic->height);
  }
  return uVar1;
}

Assistant:

static int AdjustAndCheckRectangle(const WebPPicture* const pic,
                                   int* const left, int* const top,
                                   int width, int height) {
  SnapTopLeftPosition(pic, left, top);
  if ((*left) < 0 || (*top) < 0) return 0;
  if (width <= 0 || height <= 0) return 0;
  if ((*left) + width > pic->width) return 0;
  if ((*top) + height > pic->height) return 0;
  return 1;
}